

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O0

STRING_HANDLE Azure_Base64_Encode(BUFFER_HANDLE input)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  uchar *inputBinary;
  size_t inputSize;
  LOGGER_LOG l;
  STRING_HANDLE result;
  BUFFER_HANDLE input_local;
  
  result = (STRING_HANDLE)input;
  if (input == (BUFFER_HANDLE)0x0) {
    l = (LOGGER_LOG)0x0;
    inputSize = (size_t)xlogging_get_log_function();
    if ((LOGGER_LOG)inputSize != (LOGGER_LOG)0x0) {
      (*(code *)inputSize)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/azure_base64.c"
                 ,"Azure_Base64_Encode",400,1,"Azure_Base64_Encode:: NULL input");
    }
  }
  else {
    iVar1 = BUFFER_content(input,(uchar **)&l_1);
    if ((iVar1 == 0) &&
       (iVar1 = BUFFER_size((BUFFER_HANDLE)result,(size_t *)&inputBinary), iVar1 == 0)) {
      l = (LOGGER_LOG)Base64_Encode_Internal((uchar *)l_1,(size_t)inputBinary);
    }
    else {
      l = (LOGGER_LOG)0x0;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/azure_base64.c"
                  ,"Azure_Base64_Encode",0x19a,1,"Azure_Base64_Encode:: BUFFER_routines failure.");
      }
    }
  }
  return (STRING_HANDLE)l;
}

Assistant:

STRING_HANDLE Azure_Base64_Encode(BUFFER_HANDLE input)
{
    STRING_HANDLE result;
    /*the following will happen*/
    /*1. the "data" of the binary shall be "eaten" 3 characters at a time and produce 4 base64 encoded characters for as long as there are more than 3 characters still to process*/
    /*2. the remaining characters (1 or 2) shall be encoded.*/
    /*there's a level of assumption that 'a' corresponds to 0b000000 and that '_' corresponds to 0b111111*/
    /*the encoding will use the optional [=] or [==] at the end of the encoded string, so that other less standard aware libraries can do their work*/
    /*these are the bits of the 3 normal bytes to be encoded*/

    /*Codes_SRS_BASE64_06_001: [If input is NULL then Azure_Base64_Encode shall return NULL.]*/
    if (input == NULL)
    {
        result = NULL;
        LogError("Azure_Base64_Encode:: NULL input");
    }
    else
    {
        size_t inputSize;
        const unsigned char* inputBinary;
        if ((BUFFER_content(input, &inputBinary) != 0) ||
            (BUFFER_size(input, &inputSize) != 0))
        {
            result = NULL;
            LogError("Azure_Base64_Encode:: BUFFER_routines failure.");
        }
        else
        {
            result = Base64_Encode_Internal(inputBinary, inputSize);
        }
    }
    return result;
}